

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.hpp
# Opt level: O2

bool __thiscall Limonp::Config::loadFile(Config *this,char *filePath)

{
  pointer __k;
  bool bVar1;
  istream *piVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  allocator local_2a1;
  string local_2a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_280;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vecBuf;
  ifstream ifs;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&ifs,filePath,_S_in);
  if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    vecBuf.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vecBuf.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vecBuf.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar5 = 1;
    local_280 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)this;
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ifs,(string *)&line);
      bVar7 = ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0;
      if (bVar7) break;
      trim(&line);
      if (line._M_string_length != 0) {
        std::__cxx11::string::string((string *)&local_2a0,"#",&local_2a1);
        bVar1 = strStartsWith(&line,&local_2a0);
        std::__cxx11::string::~string((string *)&local_2a0);
        if (!bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&vecBuf);
          std::__cxx11::string::string((string *)&local_2a0,"=",&local_2a1);
          bVar1 = splitStr(&line,&vecBuf,&local_2a0);
          if (bVar1) {
            lVar6 = (long)vecBuf.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vecBuf.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::~string((string *)&local_2a0);
            __k = vecBuf.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
            if (lVar6 != 0x40) goto LAB_0010ff9b;
            trim(vecBuf.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
            trim(__k + 1);
            iVar3 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::find(local_280,__k);
            if (&(this->_map)._M_t._M_impl.super__Rb_tree_header == (_Rb_tree_header *)iVar3._M_node
               ) {
              pmVar4 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_280,__k);
              std::__cxx11::string::_M_assign((string *)pmVar4);
              goto LAB_0010ff7b;
            }
            std::__cxx11::string::string((string *)&local_2a0,"key[%s] already exists.",&local_2a1);
            Logger::LoggingF(4,"Config.hpp",0x34,&local_2a0,(__k->_M_dataplus)._M_p);
          }
          else {
            std::__cxx11::string::~string((string *)&local_2a0);
LAB_0010ff9b:
            std::__cxx11::string::string((string *)&local_2a0,"line[%d:%s] is illegal.",&local_2a1);
            Logger::LoggingF(4,"Config.hpp",0x2b,&local_2a0,(ulong)uVar5,line._M_dataplus._M_p);
          }
          std::__cxx11::string::~string((string *)&local_2a0);
          goto LAB_00110011;
        }
      }
LAB_0010ff7b:
      uVar5 = uVar5 + 1;
    }
    std::ifstream::close();
LAB_00110011:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vecBuf);
    std::__cxx11::string::~string((string *)&line);
  }
  else {
    std::__cxx11::string::string((string *)&line,"open file[%s] failed.",(allocator *)&local_2a0);
    Logger::LoggingF(4,"Config.hpp",0x1a,&line,filePath);
    std::__cxx11::string::~string((string *)&line);
    bVar7 = false;
  }
  std::ifstream::~ifstream(&ifs);
  return bVar7;
}

Assistant:

bool loadFile(const char * const filePath)
            {
                ifstream ifs(filePath);
                if(!ifs)
                {
                    LogFatal("open file[%s] failed.", filePath);
                    return false;
                }
                string line;
                vector<string> vecBuf;
                uint lineno = 0;
                while(getline(ifs, line))
                {
                    lineno ++;
                    trim(line);
                    if(line.empty() || strStartsWith(line, "#"))
                    {
                        continue;
                    }
                    vecBuf.clear();
                    if(!splitStr(line, vecBuf, "=") || 2 != vecBuf.size())
                    {
                        LogFatal("line[%d:%s] is illegal.", lineno, line.c_str());
                        return false;
                    }
                    string& key = vecBuf[0];
                    string& value = vecBuf[1];
                    trim(key);
                    trim(value);
                    if(_map.end() != _map.find(key))
                    {
                        LogFatal("key[%s] already exists.", key.c_str());
                        return false;
                    }
                    _map[key] = value;
                }
                ifs.close();
                return true;
            }